

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_mul_comb_core(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *T,uchar t_len,
                     uchar *x,size_t d,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *pmVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  mbedtls_mpi l;
  mbedtls_ecp_point Txi;
  mbedtls_mpi local_c8;
  mbedtls_mpi *local_b0;
  size_t local_a8;
  mbedtls_ecp_point *local_a0;
  uchar *local_98;
  mbedtls_mpi local_90;
  mbedtls_ecp_point local_78;
  
  mbedtls_mpi_init(&local_78.X);
  mbedtls_mpi_init(&local_78.Y);
  mbedtls_mpi_init(&local_78.Z);
  iVar3 = ecp_select_comb(grp,R,T,t_len,x[d]);
  if (iVar3 == 0) {
    iVar3 = mbedtls_mpi_lset(&R->Z,1);
    if (iVar3 == 0) {
      local_a0 = T;
      local_98 = x;
      if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
        sVar2 = grp->pbits;
        local_b0 = &R->Z;
        mbedtls_mpi_init(&local_90);
        mbedtls_mpi_init(&local_c8);
        iVar4 = 0;
        local_a8 = sVar2 + 7 >> 3;
        do {
          mbedtls_mpi_fill_random(&local_90,local_a8,f_rng,p_rng);
          while (iVar3 = mbedtls_mpi_cmp_mpi(&local_90,&grp->P), -1 < iVar3) {
            iVar3 = mbedtls_mpi_shift_r(&local_90,1);
            if (iVar3 != 0) goto LAB_0011c981;
          }
          if (iVar4 == 0xb) {
            iVar3 = -0x4d00;
            goto LAB_0011c995;
          }
          iVar4 = iVar4 + 1;
          iVar3 = mbedtls_mpi_cmp_int(&local_90,1);
          pmVar1 = local_b0;
        } while (iVar3 < 1);
        iVar3 = mbedtls_mpi_mul_mpi(local_b0,local_b0,&local_90);
        if ((iVar3 == 0) && (iVar3 = ecp_modp(pmVar1,grp), iVar3 == 0)) {
          mul_count = mul_count + 1;
          iVar3 = mbedtls_mpi_mul_mpi(&local_c8,&local_90,&local_90);
          if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_c8,grp), iVar3 == 0)) {
            mul_count = mul_count + 1;
            iVar3 = mbedtls_mpi_mul_mpi(&R->X,&R->X,&local_c8);
            if ((iVar3 == 0) && (iVar3 = ecp_modp(&R->X,grp), iVar3 == 0)) {
              mul_count = mul_count + 1;
              iVar3 = mbedtls_mpi_mul_mpi(&local_c8,&local_c8,&local_90);
              if ((iVar3 == 0) && (iVar3 = ecp_modp(&local_c8,grp), iVar3 == 0)) {
                mul_count = mul_count + 1;
                pmVar1 = &R->Y;
                iVar3 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,&local_c8);
                if ((iVar3 == 0) && (iVar3 = ecp_modp(pmVar1,grp), iVar3 == 0)) {
                  mul_count = mul_count + 1;
                  iVar3 = 0;
                }
              }
            }
          }
        }
LAB_0011c981:
        mbedtls_mpi_free(&local_90);
        mbedtls_mpi_free(&local_c8);
LAB_0011c995:
        if (iVar3 != 0) goto LAB_0011c77c;
      }
      while (d != 0) {
        iVar3 = ecp_double_jac(grp,R,R);
        if (((iVar3 != 0) ||
            (iVar3 = ecp_select_comb(grp,&local_78,local_a0,t_len,local_98[d - 1]), iVar3 != 0)) ||
           (iVar3 = ecp_add_mixed(grp,R,R,&local_78), d = d - 1, iVar3 != 0)) goto LAB_0011c77c;
      }
      iVar3 = 0;
    }
  }
LAB_0011c77c:
  mbedtls_mpi_free(&local_78.X);
  mbedtls_mpi_free(&local_78.Y);
  mbedtls_mpi_free(&local_78.Z);
  return iVar3;
}

Assistant:

static int ecp_mul_comb_core( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                              const mbedtls_ecp_point T[], unsigned char t_len,
                              const unsigned char x[], size_t d,
                              int (*f_rng)(void *, unsigned char *, size_t),
                              void *p_rng )
{
    int ret;
    mbedtls_ecp_point Txi;
    size_t i;

    mbedtls_ecp_point_init( &Txi );

    /* Start with a non-zero point and randomize its coordinates */
    i = d;
    MBEDTLS_MPI_CHK( ecp_select_comb( grp, R, T, t_len, x[i] ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &R->Z, 1 ) );
    if( f_rng != 0 )
        MBEDTLS_MPI_CHK( ecp_randomize_jac( grp, R, f_rng, p_rng ) );

    while( i-- != 0 )
    {
        MBEDTLS_MPI_CHK( ecp_double_jac( grp, R, R ) );
        MBEDTLS_MPI_CHK( ecp_select_comb( grp, &Txi, T, t_len, x[i] ) );
        MBEDTLS_MPI_CHK( ecp_add_mixed( grp, R, R, &Txi ) );
    }

cleanup:
    mbedtls_ecp_point_free( &Txi );

    return( ret );
}